

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O3

void * dlsym(void *handle,char *name)

{
  void *pvVar1;
  
  if (handle < &completed_0 && (void *)((long)&__dso_handle + 7U) < handle) {
    pvVar1 = wrapped_dlsym(*(char **)((long)handle + 8),name);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    handle = *(void **)((long)handle + 0x10);
  }
  pvVar1 = dlwrap_real_dlsym(handle,name);
  return pvVar1;
}

Assistant:

void *
dlsym(void *handle, const char *name)
{
    struct libwrap *wrap = handle;

    /* Make sure that handle is actually one of our wrapped libs. */
    if (wrap < wrapped_libs ||
        wrap >= wrapped_libs + ARRAY_SIZE(wrapped_libs)) {
        wrap = NULL;
    }

    /* Failing that, anything specifically requested from the
     * libfips library should be redirected to a real GL
     * library. */

    if (wrap) {
        void *symbol = wrapped_dlsym(wrap->symbol_prefix, name);
        if (symbol)
            return symbol;
        else
            return dlwrap_real_dlsym(wrap->handle, name);
    }

    /* And anything else is some unrelated dlsym. Just pass it
     * through.  (This also covers the cases of lookups with
     * special handles such as RTLD_DEFAULT or RTLD_NEXT.)
     */
    return dlwrap_real_dlsym(handle, name);
}